

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_FromEnvTest_LegalValues::Run(void)

{
  bool bVar1;
  int32 iVar2;
  uint32 uVar3;
  int iVar4;
  int64 iVar5;
  uint64 uVar6;
  char *pcVar7;
  char *pcVar8;
  double dVar9;
  FlagSaver fs;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","FromEnvTest","LegalValues");
  setenv("BOOL_VAL1","true",1);
  setenv("BOOL_VAL2","false",1);
  setenv("BOOL_VAL3","1",1);
  setenv("BOOL_VAL4","F",1);
  bVar1 = BoolFromEnv("BOOL_VAL1",false);
  if (bVar1) {
    bVar1 = BoolFromEnv("BOOL_VAL2",true);
    if (bVar1) {
      pcVar7 = "!(BoolFromEnv(\"BOOL_VAL2\", true))";
    }
    else {
      bVar1 = BoolFromEnv("BOOL_VAL3",false);
      if (bVar1) {
        bVar1 = BoolFromEnv("BOOL_VAL4",true);
        if (bVar1) {
          pcVar7 = "!(BoolFromEnv(\"BOOL_VAL4\", true))";
        }
        else {
          bVar1 = BoolFromEnv("BOOL_VAL_UNKNOWN",true);
          if (bVar1) {
            bVar1 = BoolFromEnv("BOOL_VAL_UNKNOWN",false);
            if (!bVar1) {
              setenv("INT_VAL1","1",1);
              setenv("INT_VAL2","-1",1);
              iVar2 = Int32FromEnv("INT_VAL1",10);
              if (iVar2 == 1) {
                iVar2 = Int32FromEnv("INT_VAL2",10);
                if (iVar2 == -1) {
                  iVar2 = Int32FromEnv("INT_VAL_UNKNOWN",10);
                  if (iVar2 == 10) {
                    setenv("INT_VAL3","4294967295",1);
                    uVar3 = Uint32FromEnv("INT_VAL1",10);
                    if (uVar3 == 1) {
                      uVar3 = Uint32FromEnv("INT_VAL3",0x1e);
                      if (uVar3 == 0xffffffff) {
                        uVar3 = Uint32FromEnv("INT_VAL_UNKNOWN",10);
                        if (uVar3 == 10) {
                          setenv("INT_VAL4","1099511627776",1);
                          iVar5 = Int64FromEnv("INT_VAL1",0x14);
                          if (iVar5 == 1) {
                            iVar5 = Int64FromEnv("INT_VAL2",0x14);
                            if (iVar5 == -1) {
                              iVar5 = Int64FromEnv("INT_VAL4",0x14);
                              if (iVar5 == 0x10000000000) {
                                iVar5 = Int64FromEnv("INT_VAL_UNKNOWN",0x14);
                                if (iVar5 == 0x14) {
                                  uVar6 = Uint64FromEnv("INT_VAL1",0x1e);
                                  if (uVar6 == 1) {
                                    uVar6 = Uint64FromEnv("INT_VAL4",0x1e);
                                    if (uVar6 == 0x10000000000) {
                                      uVar6 = Uint64FromEnv("INT_VAL_UNKNOWN",0x1e);
                                      if (uVar6 == 0x1e) {
                                        setenv("DOUBLE_VAL1","0.0",1);
                                        setenv("DOUBLE_VAL2","1.0",1);
                                        setenv("DOUBLE_VAL3","-1.0",1);
                                        dVar9 = DoubleFromEnv("DOUBLE_VAL1",40.0);
                                        if ((dVar9 != 0.0) || (NAN(dVar9))) {
                                          pcVar7 = "0.0";
                                          pcVar8 = "DoubleFromEnv(\"DOUBLE_VAL1\", 40.0)";
                                        }
                                        else {
                                          dVar9 = DoubleFromEnv("DOUBLE_VAL2",40.0);
                                          if ((dVar9 != 1.0) || (NAN(dVar9))) {
                                            pcVar7 = "1.0";
                                            pcVar8 = "DoubleFromEnv(\"DOUBLE_VAL2\", 40.0)";
                                          }
                                          else {
                                            dVar9 = DoubleFromEnv("DOUBLE_VAL3",40.0);
                                            if ((dVar9 != -1.0) || (NAN(dVar9))) {
                                              pcVar7 = "-1.0";
                                              pcVar8 = "DoubleFromEnv(\"DOUBLE_VAL3\", 40.0)";
                                            }
                                            else {
                                              dVar9 = DoubleFromEnv("DOUBLE_VAL_UNKNOWN",40.0);
                                              if ((dVar9 == 40.0) && (!NAN(dVar9))) {
                                                setenv("STRING_VAL1","",1);
                                                setenv("STRING_VAL2","my happy string!",1);
                                                pcVar7 = StringFromEnv("STRING_VAL1","unknown");
                                                if (*pcVar7 == '\0') {
                                                  pcVar7 = StringFromEnv("STRING_VAL2","unknown");
                                                  iVar4 = strcmp("my happy string!",pcVar7);
                                                  if (iVar4 == 0) {
                                                    pcVar7 = StringFromEnv("STRING_VAL_UNKNOWN",
                                                                           "unknown");
                                                    iVar4 = strcmp("unknown",pcVar7);
                                                    if (iVar4 == 0) {
                                                      FlagSaver::~FlagSaver(&fs);
                                                      return;
                                                    }
                                                    pcVar8 = "\"unknown\"";
                                                    pcVar7 = 
                                                  "StringFromEnv(\"STRING_VAL_UNKNOWN\", \"unknown\")"
                                                  ;
                                                  }
                                                  else {
                                                    pcVar8 = "\"my happy string!\"";
                                                    pcVar7 = 
                                                  "StringFromEnv(\"STRING_VAL2\", \"unknown\")";
                                                  }
                                                }
                                                else {
                                                  pcVar8 = "\"\"";
                                                  pcVar7 = 
                                                  "StringFromEnv(\"STRING_VAL1\", \"unknown\")";
                                                }
                                                fprintf(_stderr,"Check failed: streq(%s, %s)\n",
                                                        pcVar8,pcVar7);
                                                goto LAB_00135845;
                                              }
                                              pcVar7 = "40.0";
                                              pcVar8 = "DoubleFromEnv(\"DOUBLE_VAL_UNKNOWN\", 40.0)"
                                              ;
                                            }
                                          }
                                        }
                                      }
                                      else {
                                        pcVar7 = "30";
                                        pcVar8 = "Uint64FromEnv(\"INT_VAL_UNKNOWN\", 30)";
                                      }
                                    }
                                    else {
                                      pcVar7 = "1099511627776ULL";
                                      pcVar8 = "Uint64FromEnv(\"INT_VAL4\", 30)";
                                    }
                                  }
                                  else {
                                    pcVar7 = "1";
                                    pcVar8 = "Uint64FromEnv(\"INT_VAL1\", 30)";
                                  }
                                }
                                else {
                                  pcVar7 = "20";
                                  pcVar8 = "Int64FromEnv(\"INT_VAL_UNKNOWN\", 20)";
                                }
                              }
                              else {
                                pcVar7 = "1099511627776LL";
                                pcVar8 = "Int64FromEnv(\"INT_VAL4\", 20)";
                              }
                            }
                            else {
                              pcVar7 = "-1";
                              pcVar8 = "Int64FromEnv(\"INT_VAL2\", 20)";
                            }
                          }
                          else {
                            pcVar7 = "1";
                            pcVar8 = "Int64FromEnv(\"INT_VAL1\", 20)";
                          }
                        }
                        else {
                          pcVar7 = "10";
                          pcVar8 = "Uint32FromEnv(\"INT_VAL_UNKNOWN\", 10)";
                        }
                      }
                      else {
                        pcVar7 = "4294967295L";
                        pcVar8 = "Uint32FromEnv(\"INT_VAL3\", 30)";
                      }
                    }
                    else {
                      pcVar7 = "1";
                      pcVar8 = "Uint32FromEnv(\"INT_VAL1\", 10)";
                    }
                  }
                  else {
                    pcVar7 = "10";
                    pcVar8 = "Int32FromEnv(\"INT_VAL_UNKNOWN\", 10)";
                  }
                }
                else {
                  pcVar7 = "-1";
                  pcVar8 = "Int32FromEnv(\"INT_VAL2\", 10)";
                }
              }
              else {
                pcVar7 = "1";
                pcVar8 = "Int32FromEnv(\"INT_VAL1\", 10)";
              }
              fprintf(_stderr,"Check failed: %s %s %s\n",pcVar7,"==",pcVar8);
              goto LAB_00135845;
            }
            pcVar7 = "!(BoolFromEnv(\"BOOL_VAL_UNKNOWN\", false))";
          }
          else {
            pcVar7 = "BoolFromEnv(\"BOOL_VAL_UNKNOWN\", true)";
          }
        }
      }
      else {
        pcVar7 = "BoolFromEnv(\"BOOL_VAL3\", false)";
      }
    }
  }
  else {
    pcVar7 = "BoolFromEnv(\"BOOL_VAL1\", false)";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar7);
LAB_00135845:
  exit(1);
}

Assistant:

TEST(FromEnvTest, LegalValues) {
  setenv("BOOL_VAL1", "true", 1);
  setenv("BOOL_VAL2", "false", 1);
  setenv("BOOL_VAL3", "1", 1);
  setenv("BOOL_VAL4", "F", 1);
  EXPECT_TRUE(BoolFromEnv("BOOL_VAL1", false));
  EXPECT_FALSE(BoolFromEnv("BOOL_VAL2", true));
  EXPECT_TRUE(BoolFromEnv("BOOL_VAL3", false));
  EXPECT_FALSE(BoolFromEnv("BOOL_VAL4", true));
  EXPECT_TRUE(BoolFromEnv("BOOL_VAL_UNKNOWN", true));
  EXPECT_FALSE(BoolFromEnv("BOOL_VAL_UNKNOWN", false));

  setenv("INT_VAL1", "1", 1);
  setenv("INT_VAL2", "-1", 1);
  EXPECT_EQ(1, Int32FromEnv("INT_VAL1", 10));
  EXPECT_EQ(-1, Int32FromEnv("INT_VAL2", 10));
  EXPECT_EQ(10, Int32FromEnv("INT_VAL_UNKNOWN", 10));

  setenv("INT_VAL3", "4294967295", 1);
  EXPECT_EQ(1, Uint32FromEnv("INT_VAL1", 10));
  EXPECT_EQ(4294967295L, Uint32FromEnv("INT_VAL3", 30));
  EXPECT_EQ(10, Uint32FromEnv("INT_VAL_UNKNOWN", 10));

  setenv("INT_VAL4", "1099511627776", 1);
  EXPECT_EQ(1, Int64FromEnv("INT_VAL1", 20));
  EXPECT_EQ(-1, Int64FromEnv("INT_VAL2", 20));
  EXPECT_EQ(1099511627776LL, Int64FromEnv("INT_VAL4", 20));
  EXPECT_EQ(20, Int64FromEnv("INT_VAL_UNKNOWN", 20));

  EXPECT_EQ(1, Uint64FromEnv("INT_VAL1", 30));
  EXPECT_EQ(1099511627776ULL, Uint64FromEnv("INT_VAL4", 30));
  EXPECT_EQ(30, Uint64FromEnv("INT_VAL_UNKNOWN", 30));

  // I pick values here that can be easily represented exactly in floating-point
  setenv("DOUBLE_VAL1", "0.0", 1);
  setenv("DOUBLE_VAL2", "1.0", 1);
  setenv("DOUBLE_VAL3", "-1.0", 1);
  EXPECT_EQ(0.0, DoubleFromEnv("DOUBLE_VAL1", 40.0));
  EXPECT_EQ(1.0, DoubleFromEnv("DOUBLE_VAL2", 40.0));
  EXPECT_EQ(-1.0, DoubleFromEnv("DOUBLE_VAL3", 40.0));
  EXPECT_EQ(40.0, DoubleFromEnv("DOUBLE_VAL_UNKNOWN", 40.0));

  setenv("STRING_VAL1", "", 1);
  setenv("STRING_VAL2", "my happy string!", 1);
  EXPECT_STREQ("", StringFromEnv("STRING_VAL1", "unknown"));
  EXPECT_STREQ("my happy string!", StringFromEnv("STRING_VAL2", "unknown"));
  EXPECT_STREQ("unknown", StringFromEnv("STRING_VAL_UNKNOWN", "unknown"));
}